

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.h
# Opt level: O2

bool __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator==
          (SamplingStrategyResponse *this,SamplingStrategyResponse *rhs)

{
  SamplingStrategyResponse SVar1;
  SamplingStrategyResponse SVar2;
  bool bVar3;
  
  if (*(int *)(this + 8) == *(int *)(rhs + 8)) {
    SVar1 = this[0x70];
    SVar2 = rhs[0x70];
    if ((((byte)SVar2 ^ (byte)SVar1) & 1) == 0) {
      if (((byte)SVar1 & 1) != 0) {
        if (*(double *)(this + 0x18) != *(double *)(rhs + 0x18)) {
          return false;
        }
        if (NAN(*(double *)(this + 0x18)) || NAN(*(double *)(rhs + 0x18))) {
          return false;
        }
      }
      if (((bool)(((byte)SVar1 & 2) >> 1) == (((byte)SVar2 >> 1 & 1) != 0)) &&
         (((((byte)SVar1 & 2) == 0 || (*(short *)(this + 0x28) == *(short *)(rhs + 0x28))) &&
          (SUB81(((ulong)(byte)SVar1 & 0xffffffffffffff04) >> 2,0) == (((byte)SVar2 >> 2 & 1) != 0))
          ))) {
        if (((char)((ulong)(byte)SVar1 & 0xffffffffffffff04) != '\0') &&
           (bVar3 = PerOperationSamplingStrategies::operator==
                              ((PerOperationSamplingStrategies *)(this + 0x30),
                               (PerOperationSamplingStrategies *)(rhs + 0x30)), !bVar3)) {
          return false;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool operator == (const SamplingStrategyResponse & rhs) const
  {
    if (!(strategyType == rhs.strategyType))
      return false;
    if (__isset.probabilisticSampling != rhs.__isset.probabilisticSampling)
      return false;
    else if (__isset.probabilisticSampling && !(probabilisticSampling == rhs.probabilisticSampling))
      return false;
    if (__isset.rateLimitingSampling != rhs.__isset.rateLimitingSampling)
      return false;
    else if (__isset.rateLimitingSampling && !(rateLimitingSampling == rhs.rateLimitingSampling))
      return false;
    if (__isset.operationSampling != rhs.__isset.operationSampling)
      return false;
    else if (__isset.operationSampling && !(operationSampling == rhs.operationSampling))
      return false;
    return true;
  }